

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EvaluationFunction.cpp
# Opt level: O1

double __thiscall
imrt::EvaluationFunction::get_delta_eval
          (EvaluationFunction *this,int angle,int b,double delta_intensity,
          vector<double,_std::allocator<double>_> *w,vector<double,_std::allocator<double>_> *Zmin,
          vector<double,_std::allocator<double>_> *Zmax,int n_voxels)

{
  double dVar1;
  int iVar2;
  bool bVar3;
  char cVar4;
  const_iterator cVar5;
  Matrix *pMVar6;
  _Base_ptr p_Var7;
  long lVar8;
  int iVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  multimap<double,_std::pair<int,_int>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>
  voxels;
  double local_90;
  key_type local_68;
  _Rb_tree<double,_std::pair<const_double,_std::pair<int,_int>_>,_std::_Select1st<std::pair<const_double,_std::pair<int,_int>_>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>
  local_60;
  
  local_68.second = b;
  local_68.first = angle;
  cVar5 = std::
          _Hashtable<std::pair<int,_int>,_std::pair<const_std::pair<int,_int>,_std::multimap<double,_std::pair<int,_int>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::multimap<double,_std::pair<int,_int>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<int,_int>_>,_imrt::pair_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->beamlet2voxel_list)._M_h,&local_68);
  if (cVar5.
      super__Node_iterator_base<std::pair<const_std::pair<int,_int>,_std::multimap<double,_std::pair<int,_int>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>_>,_true>
      ._M_cur != (__node_type *)0x0) {
    std::
    _Rb_tree<double,_std::pair<const_double,_std::pair<int,_int>_>,_std::_Select1st<std::pair<const_double,_std::pair<int,_int>_>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>
    ::_Rb_tree(&local_60,
               (_Rb_tree<double,_std::pair<const_double,_std::pair<int,_int>_>,_std::_Select1st<std::pair<const_double,_std::pair<int,_int>_>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>
                *)((long)cVar5.
                         super__Node_iterator_base<std::pair<const_std::pair<int,_int>,_std::multimap<double,_std::pair<int,_int>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>_>,_true>
                         ._M_cur + 0x10));
    if ((_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_left ==
        &local_60._M_impl.super__Rb_tree_header) {
      local_90 = 0.0;
    }
    else {
      iVar9 = 0;
      local_90 = 0.0;
      p_Var7 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
      do {
        iVar2 = *(int *)&p_Var7[1]._M_parent;
        lVar8 = (long)*(int *)((long)&p_Var7[1]._M_parent + 4);
        pMVar6 = Volume::getDepositionMatrix
                           ((this->volumes->
                            super__Vector_base<imrt::Volume,_std::allocator<imrt::Volume>_>)._M_impl
                            .super__Vector_impl_data._M_start + iVar2,angle);
        dVar11 = pMVar6->p[lVar8][b] * delta_intensity;
        cVar4 = '\x03';
        if ((dVar11 != 0.0) || (NAN(dVar11))) {
          dVar10 = *(double *)
                    (*(long *)&(this->Z).
                               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[iVar2].
                               super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data + lVar8 * 8);
          dVar1 = (Zmin->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start[iVar2];
          dVar12 = dVar11 + dVar10;
          if ((dVar1 <= dVar10) || (dVar1 <= dVar12)) {
            if (dVar1 <= dVar10) {
              dVar10 = 0.0;
              if (dVar12 < dVar1) {
                dVar10 = (dVar1 - dVar12) * (dVar1 - dVar12) *
                         (w->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_start[iVar2] + 0.0;
              }
            }
            else {
              dVar10 = 0.0 - (dVar1 - dVar10) * (dVar1 - dVar10) *
                             (w->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                             super__Vector_impl_data._M_start[iVar2];
            }
          }
          else {
            dVar10 = ((dVar10 - dVar1) + (dVar10 - dVar1) + dVar11) *
                     (w->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start[iVar2] * dVar11 + 0.0;
          }
          dVar1 = *(double *)
                   (*(long *)&(this->Z).
                              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[iVar2].
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data + lVar8 * 8);
          dVar12 = (Zmax->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start[iVar2];
          dVar13 = dVar11 + dVar1;
          if ((dVar1 <= dVar12) || (dVar13 <= dVar12)) {
            if (dVar1 <= dVar12) {
              if (dVar12 < dVar13) {
                dVar10 = dVar10 + (dVar13 - dVar12) * (dVar13 - dVar12) *
                                  (w->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                  super__Vector_impl_data._M_start[iVar2];
              }
            }
            else {
              dVar10 = dVar10 - (dVar1 - dVar12) * (dVar1 - dVar12) *
                                (w->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                super__Vector_impl_data._M_start[iVar2];
            }
          }
          else {
            dVar10 = dVar10 + ((dVar1 - dVar12) + (dVar1 - dVar12) + dVar11) *
                              (w->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                              super__Vector_impl_data._M_start[iVar2] * dVar11;
          }
          local_90 = local_90 +
                     dVar10 / (double)(this->nb_voxels).
                                      super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_start[iVar2];
          bVar3 = n_voxels <= iVar9;
          iVar9 = iVar9 + 1;
          cVar4 = bVar3 * '\x02';
        }
      } while (((cVar4 == '\x03') || (cVar4 == '\0')) &&
              (p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7),
              (_Rb_tree_header *)p_Var7 != &local_60._M_impl.super__Rb_tree_header));
    }
    std::
    _Rb_tree<double,_std::pair<const_double,_std::pair<int,_int>_>,_std::_Select1st<std::pair<const_double,_std::pair<int,_int>_>_>,_std::less<double>,_std::allocator<std::pair<const_double,_std::pair<int,_int>_>_>_>
    ::~_Rb_tree(&local_60);
    return local_90;
  }
  std::__throw_out_of_range("_Map_base::at");
}

Assistant:

double EvaluationFunction::get_delta_eval(int angle, int b, double delta_intensity,
	vector<double>& w, vector<double>& Zmin, vector<double>& Zmax,int n_voxels) const{

	 multimap<double, pair<int,int> > voxels =
	                                   beamlet2voxel_list.at(make_pair(angle,b));
	 double delta_F=0.0;

	 int i=0;
	 for(auto voxel:voxels){
		 int o=voxel.second.first, k=voxel.second.second;
		 const Matrix&  Dep = volumes[o].getDepositionMatrix(angle);
		 double delta = Dep(k,b)*(delta_intensity);
		 if(delta==0.0) continue;

		 double pen=0.0;
 		 //with the change in the dose of a voxel we can incrementally modify the value of F
 		 if(Z[o][k] < Zmin[o] && Z[o][k] + delta < Zmin[o]) //update the penalty
 			pen += w[o]*delta*(delta+2*(Z[o][k]-Zmin[o]));
 		 else if(Z[o][k] < Zmin[o]) //the penalty disappears
 			pen -=  w[o] * ( pow(Zmin[o]-Z[o][k], 2) );
 		 else if(Z[o][k] + delta < Zmin[o]) //the penalty appears
 			pen +=  w[o] * ( pow(Zmin[o]-(Z[o][k]+delta), 2) );

 		 if(Z[o][k] > Zmax[o] && Z[o][k] + delta > Zmax[o]) //update the penalty
 			 pen += w[o]*delta*(delta+2*(-Zmax[o] + Z[o][k]));
 		 else if(Z[o][k] > Zmax[o]) //the penalty disappears
 			 pen -=  w[o] * ( pow(Z[o][k]-Zmax[o], 2) );
 		 else if(Z[o][k] + delta > Zmax[o]) //the penalty appears
 			 pen +=  w[o] * ( pow(Z[o][k]+delta - Zmax[o], 2) );

 		 delta_F += pen/nb_voxels[o];
		 i++; if(i>n_voxels) break;
	 }
	 return delta_F;
}